

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData>::
emplace<QGuiApplicationPrivate::SynthesizedMouseData_const&>
          (QHash<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData> *this,QWindow **key,
          SynthesizedMouseData *args)

{
  uint *puVar1;
  long in_FS_OFFSET;
  piter pVar2;
  SynthesizedMouseData local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(uint **)this;
  if (puVar1 == (uint *)0x0) {
    local_58.pos.xp = 0.0;
LAB_002b859c:
    QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::detach
              ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)this);
    pVar2 = (piter)emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData_const&>
                             (this,key,args);
    QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::~QHash
              ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)&local_58);
  }
  else {
    if (1 < *puVar1) {
      local_58.pos.xp = (qreal)puVar1;
      if (*puVar1 != 0xffffffff) {
        LOCK();
        *puVar1 = *puVar1 + 1;
        UNLOCK();
      }
      goto LAB_002b859c;
    }
    if (*(ulong *)(puVar1 + 2) < *(ulong *)(puVar1 + 4) >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData_const&>
                                 (this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_002b8633;
    }
    local_58.pos.xp = (args->pos).xp;
    local_58.pos.yp = (args->pos).yp;
    local_58.screenPos.xp = (args->screenPos).xp;
    local_58.screenPos.yp = (args->screenPos).yp;
    local_58.window.wp.d = (args->window).wp.d;
    local_58.window.wp.value = (args->window).wp.value;
    if (local_58.window.wp.d != (Data *)0x0) {
      LOCK();
      ((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar2 = (piter)QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::
                   emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData>
                             ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)this
                              ,key,&local_58);
    QWeakPointer<QObject>::~QWeakPointer(&local_58.window.wp);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_002b8633:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }